

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::FrexpCase::compare(FrexpCase *this,void **inputs,void **outputs)

{
  float a;
  Precision PVar1;
  int iVar2;
  pointer pSVar3;
  float fVar4;
  uint uVar5;
  deUint32 dVar6;
  ostream *poVar7;
  uint uVar8;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar9;
  ulong uVar10;
  int refOut1;
  float refOut0;
  FrexpCase *local_48;
  void **local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  local_48 = this;
  local_40 = inputs;
  uVar5 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  uVar8 = ~(-1 << (0x17 - (&DAT_00817b9c)[(ulong)PVar1 * 4] & 0x1f));
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar5;
  }
  do {
    if (uVar10 == uVar9) {
LAB_0047656b:
      return (long)(int)uVar5 <= (long)uVar9;
    }
    a = *(float *)((long)*outputs + uVar9 * 4);
    iVar2 = *(int *)((long)outputs[1] + uVar9 * 4);
    frexp((Functional *)&refOut0,(double)(ulong)*(uint *)((long)*local_40 + uVar9 * 4),&refOut1);
    fVar4 = refOut0;
    dVar6 = getUlpDiffIgnoreZeroSign(a,refOut0);
    if ((uVar8 < dVar6) || (iVar2 != refOut1)) {
      poVar7 = std::operator<<((ostream *)&(local_48->super_CommonFunctionCase).m_failMsg,
                               "Expected [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
      poVar7 = std::operator<<(poVar7,"] = ");
      local_34.value = fVar4;
      poVar7 = Functional::operator<<(poVar7,&local_34);
      poVar7 = std::operator<<(poVar7,", ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,refOut1);
      poVar7 = std::operator<<(poVar7," with ULP threshold ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar8;
      poVar7 = tcu::Format::operator<<(poVar7,hex);
      poVar7 = std::operator<<(poVar7,", got ULP diff ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = dVar6;
      tcu::Format::operator<<(poVar7,hex_00);
      goto LAB_0047656b;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				signedZero					= false;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}